

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shuffling.cpp
# Opt level: O1

void Shell::Shuffling::shuffle(Unit *unit)

{
  Clause *clause;
  undefined4 in_EDX;
  Shufflable sh;
  undefined1 local_10;
  undefined7 uStack_f;
  uint uStack_8;
  
  if ((unit->field_0x4 & 1) == 0) {
    clause = Kernel::Unit::asClause(unit);
    shuffle(clause);
    return;
  }
  uStack_f = (undefined7)*(undefined8 *)(unit + 1);
  uStack_8._0_1_ = (undefined1)((ulong)*(undefined8 *)(unit + 1) >> 0x38);
  sh._inner._content[3] = '\0';
  sh._inner._content[4] = '\0';
  sh._inner._content[5] = '\0';
  sh._inner._content[6] = '\0';
  sh._inner._0_4_ = uStack_8;
  sh._inner._8_4_ = in_EDX;
  shuffleIter((Shuffling *)(CONCAT71(uStack_f,local_10) & 0xfffffffffffffffc),sh);
  return;
}

Assistant:

void Shuffling::shuffle(Unit* unit)
{
  // cout << "Bef: " << unit->toString() << std::endl;

  if (unit->isClause()) {
    shuffle(unit->asClause());
  } else {
    shuffle(static_cast<FormulaUnit*>(unit)->formula());
  }

  // cout << "Aft: " << unit->toString() << std::endl;
}